

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  undefined1 local_50 [48];
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    GetLocation((Location *)(local_50 + 0x10),this);
    std::make_unique<wabt::ExportModuleField,wabt::Location>((Location *)local_50);
    RVar1 = Expect(this,Export);
    if (RVar1.enum_ == Error) {
      EVar2 = Error;
    }
    else {
      EVar2 = Error;
      RVar1 = ParseQuotedText(this,(string *)(local_50._0_8_ + 0x40),true);
      if (RVar1.enum_ != Error) {
        RVar1 = ParseExportDesc(this,(Export *)(local_50._0_8_ + 0x40));
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            local_50._8_8_ = local_50._0_8_;
            local_50._0_8_ = (long *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                                        *)(local_50 + 8));
            if ((long *)local_50._8_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_50._8_8_ + 8))();
            }
            local_50._8_8_ = (char *)0x0;
            EVar2 = Ok;
          }
        }
      }
    }
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseExportModuleField(Module* module) {
  WABT_TRACE(ParseExportModuleField);
  EXPECT(Lpar);
  auto field = std::make_unique<ExportModuleField>(GetLocation());
  EXPECT(Export);
  CHECK_RESULT(ParseQuotedText(&field->export_.name));
  CHECK_RESULT(ParseExportDesc(&field->export_));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}